

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

FrameDisplay *
Js::JavascriptOperators::OP_LdFrameDisplay(void *argHead,void *argEnv,ScriptContext *scriptContext)

{
  bool bVar1;
  ushort uVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  Recycler *this;
  undefined4 *puVar7;
  FrameDisplay *this_00;
  void *item;
  uint index;
  ushort uVar8;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  uVar2 = *(ushort *)((long)argEnv + 2);
  uVar8 = uVar2 + 1;
  data._32_8_ = argHead;
  if (uVar8 == 0) {
    ::Math::DefaultOverflowPolicy();
  }
  local_78 = (undefined1  [8])&FrameDisplay::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4e91f59;
  data.filename._0_4_ = 0x1bb4;
  data.typeinfo = (type_info *)((ulong)uVar8 * 8);
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  BVar6 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar5) goto LAB_00ab8831;
    *puVar7 = 0;
  }
  this_00 = (FrameDisplay *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this,(size_t)((type_info *)((ulong)uVar8 * 8) + 8));
  if (this_00 == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar5) {
LAB_00ab8831:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  this_00->tag = true;
  this_00->strictMode = false;
  this_00->length = uVar8;
  this_00->unused = 0;
  if (1 < uVar8) {
    index = 0;
    do {
      item = FrameDisplay::GetItem((FrameDisplay *)argEnv,index);
      index = index + 1;
      FrameDisplay::SetItem(this_00,index,item);
    } while ((ushort)index < uVar2);
  }
  FrameDisplay::SetItem(this_00,0,(void *)data._32_8_);
  pTVar3->noJsReentrancy = bVar1;
  return this_00;
}

Assistant:

FrameDisplay* JavascriptOperators::OP_LdFrameDisplay(void *argHead, void *argEnv, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrObj_LdFrameDisplay, reentrancylock, scriptContext->GetThreadContext());
        // Build a display of nested frame objects.
        // argHead is the current scope; argEnv is either the lone trailing scope or an array of scopes
        // which we append to the new display.

        // Note that there are cases in which a function with no local frame must construct a display to pass
        // to the function(s) nested within it. In such a case, argHead will be a null object, and it's not
        // strictly necessary to include it. But such cases are rare and not perf critical, so it's not
        // worth the extra complexity to notify the nested functions that they can "skip" this slot in the
        // frame display when they're loading scopes nested outside it.

        FrameDisplay *pDisplay = nullptr;
        FrameDisplay *envDisplay = (FrameDisplay*)argEnv;
        uint16 length = UInt16Math::Add(envDisplay->GetLength(), 1);

        pDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
        for (uint16 j = 0; j < length - 1; j++)
        {
            pDisplay->SetItem(j + 1, envDisplay->GetItem(j));
        }

        pDisplay->SetItem(0, argHead);

        return pDisplay;
        JIT_HELPER_END(ScrObj_LdFrameDisplay);
    }